

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# faidx.c
# Opt level: O0

void fai_destroy(faidx_t *fai)

{
  int local_14;
  int i;
  faidx_t *fai_local;
  
  for (local_14 = 0; local_14 < fai->n; local_14 = local_14 + 1) {
    free(fai->name[local_14]);
  }
  free(fai->name);
  kh_destroy_s(fai->hash);
  if (fai->bgzf != (BGZF *)0x0) {
    bgzf_close(fai->bgzf);
  }
  free(fai);
  return;
}

Assistant:

void fai_destroy(faidx_t *fai)
{
    int i;
    for (i = 0; i < fai->n; ++i) free(fai->name[i]);
    free(fai->name);
    kh_destroy(s, fai->hash);
    if (fai->bgzf) bgzf_close(fai->bgzf);
    free(fai);
}